

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O3

void __thiscall
HashTable<ObjWriteGuardBucket,Memory::ArenaAllocator>::
Or<ObjWriteGuardBucket(*)(ObjWriteGuardBucket,ObjWriteGuardBucket)>
          (HashTable<ObjWriteGuardBucket,Memory::ArenaAllocator> *this,
          HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator> *this2,
          _func_ObjWriteGuardBucket_ObjWriteGuardBucket_ObjWriteGuardBucket *fn)

{
  int iVar1;
  SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *pSVar2;
  code *pcVar3;
  bool bVar4;
  NodeBase *pNVar5;
  Type *pTVar6;
  Type *pTVar7;
  Type *pTVar8;
  ObjWriteGuardBucket OVar9;
  ulong uVar10;
  undefined1 local_60 [8];
  EditingIterator iter;
  undefined1 local_40 [8];
  Iterator iter2;
  
  if (*(int *)(this + 8) != 0) {
    pNVar5 = (NodeBase *)__tls_get_addr(&PTR_01548f08);
    uVar10 = 0;
    iter.last = pNVar5;
    do {
      iter2.list = this2->table + uVar10;
      local_40 = (undefined1  [8])iter2.list;
      if (iter2.list ==
          (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)&pNVar5->next = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar4) {
LAB_003ec81b:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *(undefined4 *)&pNVar5->next = 0;
      }
      pSVar2 = (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
               ((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      iter2.list = (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0;
      if ((undefined1  [8])pSVar2 != local_40) {
        iter2.list = pSVar2;
      }
      local_60 = (undefined1  [8])(uVar10 * 0x10 + *(long *)(this + 0x10));
      iter.super_Iterator.current = (NodeBase *)0x0;
      iter.super_Iterator.list =
           (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)local_60;
      while (bVar4 = SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                     EditingIterator::Next((EditingIterator *)local_60), bVar4) {
        pTVar6 = SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator
                 ::Data((Iterator *)local_60);
        if ((undefined1  [8])iter2.list != local_40 &&
            iter2.list !=
            (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          while (iVar1 = pTVar6->value,
                pTVar7 = SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                         Iterator::Data((Iterator *)local_40), iVar1 < pTVar7->value) {
            pTVar7 = SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                     EditingIterator::InsertNodeBefore
                               ((EditingIterator *)local_60,*(ArenaAllocator **)this);
            pTVar8 = SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                     Iterator::Data((Iterator *)local_40);
            pTVar7->value = pTVar8->value;
            pTVar8 = SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                     Iterator::Data((Iterator *)local_40);
            OVar9 = (*fn)((ObjWriteGuardBucket)0x0,(pTVar8->element).writeGuards);
            (pTVar7->element).writeGuards = OVar9.writeGuards;
            if (iter2.list ==
                (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              pNVar5 = iter.last;
              *(undefined4 *)&(iter.last)->next = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                 ,0x76,"(current != nullptr)","current != nullptr");
              if (!bVar4) goto LAB_003ec81b;
              *(undefined4 *)&pNVar5->next = 0;
            }
            pSVar2 = (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
                     ((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
            iter2.list = (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>
                          *)0x0;
            if ((undefined1  [8])pSVar2 != local_40) {
              iter2.list = pSVar2;
            }
            if ((iter2.list ==
                 (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0)
               || ((undefined1  [8])iter2.list == local_40)) break;
          }
        }
        if ((iter2.list ==
             (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) ||
           ((undefined1  [8])iter2.list == local_40)) break;
        iVar1 = pTVar6->value;
        pTVar7 = SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator
                 ::Data((Iterator *)local_40);
        if (iVar1 == pTVar7->value) {
          OVar9.writeGuards = (pTVar6->element).writeGuards;
          pTVar7 = SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                   Iterator::Data((Iterator *)local_40);
          OVar9 = (*fn)(OVar9,(pTVar7->element).writeGuards);
          (pTVar6->element).writeGuards = OVar9.writeGuards;
          if (iter2.list ==
              (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            pNVar5 = iter.last;
            *(undefined4 *)&(iter.last)->next = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                               ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar4) goto LAB_003ec81b;
            *(undefined4 *)&pNVar5->next = 0;
          }
          pSVar2 = (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
                   ((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
          iter2.list = (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
                       0x0;
          if ((undefined1  [8])pSVar2 != local_40) {
            iter2.list = pSVar2;
          }
        }
      }
      pNVar5 = iter.last;
      if ((iter2.list !=
           (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) &&
         ((undefined1  [8])iter2.list != local_40)) {
        do {
          pTVar6 = SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                   EditingIterator::InsertNodeBefore
                             ((EditingIterator *)local_60,*(ArenaAllocator **)this);
          pTVar7 = SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                   Iterator::Data((Iterator *)local_40);
          pTVar6->value = pTVar7->value;
          pTVar7 = SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                   Iterator::Data((Iterator *)local_40);
          OVar9 = (*fn)((ObjWriteGuardBucket)0x0,(pTVar7->element).writeGuards);
          (pTVar6->element).writeGuards = OVar9.writeGuards;
          if (iter2.list ==
              (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)&pNVar5->next = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                               ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar4) goto LAB_003ec81b;
            *(undefined4 *)&pNVar5->next = 0;
          }
          pSVar2 = (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
                   ((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
          iter2.list = (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
                       0x0;
          if ((undefined1  [8])pSVar2 != local_40) {
            iter2.list = pSVar2;
          }
        } while ((iter2.list !=
                  (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0)
                && ((undefined1  [8])iter2.list != local_40));
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < *(uint *)(this + 8));
  }
  return;
}

Assistant:

void Or(HashTable<T> * this2, Fn fn)
    {
        for (uint i = 0; i < this->tableSize; i++)
        {
            _TYPENAME SListBase<Bucket<T>>::Iterator iter2(&this2->table[i]);
            iter2.Next();
            FOREACH_SLISTBASE_ENTRY_EDITING(Bucket<T>, bucket, &this->table[i], iter)
            {
                while (iter2.IsValid() && bucket.value < iter2.Data().value)
                {
                    Bucket<T> * newBucket = iter.InsertNodeBefore(this->alloc);
                    newBucket->value = iter2.Data().value;
                    newBucket->element = fn(nullptr, iter2.Data().element);
                    iter2.Next();
                }

                if (!iter2.IsValid())
                {
                    break;
                }
                if (bucket.value == iter2.Data().value)
                {
                    bucket.element = fn(bucket.element, iter2.Data().element);
                    iter2.Next();
                }
            } NEXT_SLISTBASE_ENTRY_EDITING;

            while (iter2.IsValid())
            {
                Bucket<T> * newBucket = iter.InsertNodeBefore(this->alloc);
                newBucket->value = iter2.Data().value;
                newBucket->element = fn(nullptr, iter2.Data().element);
                iter2.Next();
            }
        }
    }